

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

typed_address<pstore::trailer>
pstore::database::get_footer_pos<pstore::file::file_base>(file_base *file)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  type header_storage;
  
  iVar3 = (*file->_vptr_file_base[2])();
  if ((char)iVar3 == '\0') {
    assert_failed("file.is_open ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/database.hpp"
                  ,0x237);
  }
  header_storage._32_8_ = 0;
  header_storage._40_8_ = 0;
  header_storage._16_8_ = 0;
  header_storage._24_8_ = 0;
  header_storage.__align = (anon_struct_8_0_00000001_for___align)0x0;
  header_storage._8_8_ = 0;
  (*file->_vptr_file_base[6])(file,0);
  pstore::file::file_base::read<pstore::header,void>(file,(header *)&header_storage.__align);
  bVar2 = std::operator!=((array<unsigned_char,_4UL> *)&header_storage.__align,
                          (array<unsigned_char,_4UL> *)&header::file_signature1);
  if ((bVar2) || (header_storage._4_4_ != 0x507ffff)) {
    (*file->_vptr_file_base[5])(&bStack_68,file);
    raise<pstore::error_code,std::__cxx11::string>(header_corrupt,&bStack_68);
  }
  if (((header_storage._12_4_ != 0x30) || (header_storage._8_2_ != 1)) ||
     (header_storage._10_2_ != 0xd)) {
    (*file->_vptr_file_base[5])(&bStack_68,file);
    raise<pstore::error_code,std::__cxx11::string>(header_version_mismatch,&bStack_68);
  }
  bVar2 = header::is_valid((header *)&header_storage.__align);
  uVar1 = header_storage._40_8_;
  if (!bVar2) {
    (*file->_vptr_file_base[5])(&bStack_68,file);
    raise<pstore::error_code,std::__cxx11::string>(header_corrupt,&bStack_68);
  }
  iVar3 = (*file->_vptr_file_base[9])(file);
  if (((0x3f < (ulong)uVar1) && (0xaf < CONCAT44(extraout_var,iVar3))) &&
     ((ulong)uVar1 <= CONCAT44(extraout_var,iVar3) - 0x70)) {
    return (typed_address<pstore::trailer>)(address)uVar1;
  }
  (*file->_vptr_file_base[5])(&bStack_68,file);
  raise<pstore::error_code,std::__cxx11::string>(header_corrupt,&bStack_68);
}

Assistant:

auto database::get_footer_pos (File & file) -> typed_address<trailer> {
        static_assert (std::is_base_of<file::file_base, File>::value,
                       "File type must be derived from file::file_base");
        PSTORE_ASSERT (file.is_open ());

        std::aligned_storage<sizeof (header), alignof (header)>::type header_storage{};
        auto h = reinterpret_cast<header *> (&header_storage);
        file.seek (0);
        file.read (h);

        auto const dtor = [] (header * const p) { p->~header (); };
        std::unique_ptr<header, decltype (dtor)> deleter (h, dtor);

#if PSTORE_SIGNATURE_CHECKS_ENABLED
        if (h->a.signature1 != header::file_signature1 ||
            h->a.signature2 != header::file_signature2) {
            raise (error_code::header_corrupt, file.path ());
        }
#endif
        if (h->a.header_size != sizeof (class header) || h->a.version[0] != header::major_version ||
            h->a.version[1] != header::minor_version) {
            raise (error_code::header_version_mismatch, file.path ());
        }
        if (!h->is_valid ()) {
            raise (pstore::error_code::header_corrupt, file.path ());
        }

        typed_address<trailer> const result = h->footer_pos.load ();
        std::uint64_t const footer_offset = result.absolute ();
        std::uint64_t const file_size = file.size ();
        if (footer_offset < leader_size || file_size < leader_size + sizeof (trailer) ||
            footer_offset > file_size - sizeof (trailer)) {
            raise (error_code::header_corrupt, file.path ());
        }
        return result;
    }